

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimate_halfway.cc
# Opt level: O3

int main(void)

{
  double *pdVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  sample *psVar7;
  int iVar8;
  sample *psVar9;
  long lVar10;
  ostream *poVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  sample *psVar16;
  sample *psVar17;
  size_t __n;
  undefined4 uVar18;
  undefined4 uVar19;
  sample samples [10000];
  double dStack_27158;
  double dStack_27150;
  double adStack_27148 [2];
  sample sStack_27138;
  sample asStack_27128 [14];
  double adStack_27048 [19971];
  
  lVar14 = 8;
  dVar6 = 0.0;
  do {
    iVar8 = rand();
    dVar4 = (double)iVar8 * 4.656612873077393e-10 * 6.283185307179586 + 0.0;
    adStack_27148[1] = sin(dVar4);
    dVar5 = exp(dVar4 / -6.283185307179586);
    dVar5 = dVar5 * adStack_27148[1] * adStack_27148[1];
    dVar6 = dVar6 + dVar5;
    *(double *)((long)adStack_27148 + lVar14 + 8) = dVar4;
    *(double *)((long)&sStack_27138.x + lVar14) = dVar5;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x27108);
  std::
  __introsort_loop<sample*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(sample_const&,sample_const&)>>
            (&sStack_27138,(sample *)(adStack_27048 + 0x4e02),0x1a,
             (_Iter_comp_iter<bool_(*)(const_sample_&,_const_sample_&)>)0x1014a4);
  __n = 0x10;
  psVar9 = &sStack_27138;
  psVar16 = asStack_27128;
  do {
    psVar17 = (sample *)((long)&sStack_27138.x + __n);
    dVar4 = psVar17->x;
    if (sStack_27138.x <= dVar4) {
      dVar5 = *(double *)((long)asStack_27128 + (__n - 8));
      dVar2 = psVar9->x;
      psVar9 = psVar17;
      psVar7 = psVar16;
      while (dVar4 < dVar2) {
        psVar9 = psVar7 + -1;
        dVar2 = psVar7[-1].p_x;
        psVar7->x = psVar7[-1].x;
        psVar7->p_x = dVar2;
        dVar2 = psVar7[-2].x;
        psVar7 = psVar9;
      }
      psVar9->x = dVar4;
      psVar9->p_x = dVar5;
    }
    else {
      dStack_27158 = psVar17->x;
      dStack_27150 = *(double *)((long)asStack_27128 + (__n - 8));
      memmove(asStack_27128,&sStack_27138,__n);
      sStack_27138.x = dStack_27158;
      sStack_27138.p_x = dStack_27150;
    }
    lVar14 = std::cout;
    __n = __n + 0x10;
    psVar16 = psVar16 + 1;
    psVar9 = psVar17;
  } while (__n != 0x100);
  lVar10 = 0x100;
  pdVar12 = adStack_27048;
  do {
    pdVar12 = pdVar12 + 2;
    dVar4 = *(double *)((long)&sStack_27138.x + lVar10);
    dVar5 = *(double *)((long)asStack_27128 + lVar10 + -8);
    pdVar15 = pdVar12;
    if (*(double *)((long)adStack_27148 + lVar10) <= dVar4) {
      pdVar13 = (double *)((long)&sStack_27138.x + lVar10);
    }
    else {
      do {
        pdVar13 = pdVar15 + -2;
        *pdVar15 = pdVar15[-2];
        pdVar15[1] = pdVar15[-1];
        pdVar1 = pdVar15 + -4;
        pdVar15 = pdVar13;
      } while (dVar4 < *pdVar1);
    }
    *pdVar13 = dVar4;
    pdVar13[1] = dVar5;
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 160000);
  dVar4 = 0.0;
  lVar10 = 8;
  do {
    dVar4 = dVar4 + *(double *)((long)&sStack_27138.x + lVar10);
    if (dVar6 * 0.5 <= dVar4) {
      uVar3 = *(undefined8 *)((long)adStack_27148 + lVar10 + 8);
      uVar18 = (undefined4)uVar3;
      uVar19 = (undefined4)((ulong)uVar3 >> 0x20);
      goto LAB_001016af;
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x27108);
  uVar18 = 0;
  uVar19 = 0;
LAB_001016af:
  *(uint *)(memmove + *(long *)(std::cout + -0x18)) =
       *(uint *)(memmove + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar14 + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Average = ",10);
  poVar11 = std::ostream::_M_insert<double>(dVar6 / 10000.0);
  dStack_27158._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&dStack_27158,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Area under curve = ",0x13);
  poVar11 = std::ostream::_M_insert<double>((dVar6 * 6.283185307179586) / 10000.0);
  dStack_27158._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&dStack_27158,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Halfway = ",10);
  poVar11 = std::ostream::_M_insert<double>((double)CONCAT44(uVar19,uVar18));
  dStack_27158 = (double)CONCAT71(dStack_27158._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&dStack_27158,1);
  return 0;
}

Assistant:

int main() {
    const unsigned int N = 10000;
    sample samples[N];
    double sum = 0.0;

    // Iterate through all of our samples.

    for (unsigned int i = 0; i < N; i++) {
        // Get the area under the curve.
        auto x = random_double(0, 2*pi);
        auto sin_x = std::sin(x);
        auto p_x = exp(-x / (2*pi)) * sin_x * sin_x;
        sum += p_x;

        // Store this sample.
        sample this_sample = {x, p_x};
        samples[i] = this_sample;
    }

    // Sort the samples by x.
    std::sort(std::begin(samples), std::end(samples), compare_by_x);

    // Find out the sample at which we have half of our area.
    double half_sum = sum / 2.0;
    double halfway_point = 0.0;
    double accum = 0.0;
    for (unsigned int i = 0; i < N; i++){
        accum += samples[i].p_x;
        if (accum >= half_sum) {
            halfway_point = samples[i].x;
            break;
        }
    }

    std::cout << std::fixed << std::setprecision(12);
    std::cout << "Average = " << sum / N << '\n';
    std::cout << "Area under curve = " << 2 * pi * sum / N << '\n';
    std::cout << "Halfway = " << halfway_point << '\n';
}